

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::FormatArg::formatImpl<char[14]>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  long lVar1;
  undefined4 in_ECX;
  char *in_RDX;
  ostream *in_RSI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  char (*in_stack_ffffffffffffffc8) [14];
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  formatValue<char[14]>
            (in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
             (int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }